

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::QtAutoGen(cmGlobalGenerator *this)

{
  bool bVar1;
  undefined1 local_280 [8];
  cmQtAutoGenGlobalInitializer initializer;
  cmGlobalGenerator *this_local;
  
  initializer.Keywords_.ui.field_2._8_8_ = this;
  cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer
            ((cmQtAutoGenGlobalInitializer *)local_280,&this->LocalGenerators);
  bVar1 = cmQtAutoGenGlobalInitializer::generate((cmQtAutoGenGlobalInitializer *)local_280);
  cmQtAutoGenGlobalInitializer::~cmQtAutoGenGlobalInitializer
            ((cmQtAutoGenGlobalInitializer *)local_280);
  return bVar1;
}

Assistant:

bool cmGlobalGenerator::QtAutoGen()
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmQtAutoGenGlobalInitializer initializer(this->LocalGenerators);
  return initializer.generate();
#else
  return true;
#endif
}